

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFile
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file)

{
  size_type *psVar1;
  undefined8 *puVar2;
  GeneratorOptions *pGVar3;
  GeneratorOptions *pGVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string *filename;
  Printer *pPVar6;
  FileDescriptor *pFVar7;
  long lVar8;
  undefined8 *puVar9;
  long *plVar10;
  _Rb_tree_node_base *p_Var11;
  GeneratorOptions *pGVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *this_00;
  int iVar18;
  FileToc *pFVar19;
  bool bVar20;
  string result;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  files;
  set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  provided;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  GeneratorOptions *local_110;
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Printer *local_c0;
  string local_b8;
  undefined1 local_98 [32];
  _Rb_tree_node_base *local_78;
  size_t local_70;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  _Rb_tree_node_base *local_38;
  
  local_110 = (GeneratorOptions *)file;
  local_c0 = printer;
  local_38 = (_Rb_tree_node_base *)this;
  io::Printer::Print(printer,
                     "/**\n * @fileoverview\n * @enhanceable\n * @public\n */\n// GENERATED CODE -- DO NOT EDIT!\n\n"
                    );
  pPVar6 = local_c0;
  if (options->import_style == kImportCommonJs) {
    io::Printer::Print(local_c0,"var jspb = require(\'google-protobuf\');\n");
    io::Printer::Print(pPVar6,"var goog = jspb;\n");
    io::Printer::Print(pPVar6,"var global = Function(\'return this\')();\n\n");
    if (0 < *(int *)((long)&(local_110->output_dir).field_2 + 8)) {
      iVar18 = 0;
      do {
        pFVar7 = FileDescriptor::dependency((FileDescriptor *)local_110,iVar18);
        filename = *(string **)pFVar7;
        anon_unknown_0::ModuleAlias((string *)local_68,filename);
        plVar10 = (long *)(local_110->output_dir)._M_dataplus._M_p;
        lVar8 = std::__cxx11::string::find((char *)filename,0x35bdf0,0);
        if (lVar8 == 0) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          local_108._0_8_ = (GeneratorOptions *)0x10;
          local_130._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)local_108);
          local_130.field_2._M_allocated_capacity = local_108._0_8_;
          *(undefined8 *)local_130._M_dataplus._M_p = 0x702d656c676f6f67;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 8) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 9) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 10) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xb) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xc) = 'b';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xd) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xe) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p + 0xf) = '/';
          local_130._M_string_length = local_108._0_8_;
          local_130._M_dataplus._M_p[local_108._0_8_] = '\0';
        }
        else {
          lVar8 = plVar10[1];
          if (lVar8 == 0) {
            lVar15 = 0;
          }
          else {
            lVar14 = 0;
            lVar15 = 0;
            do {
              lVar15 = lVar15 + (ulong)(*(char *)(*plVar10 + lVar14) == '/');
              lVar14 = lVar14 + 1;
            } while (lVar8 != lVar14);
          }
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          if (lVar15 == 0) {
            local_130._M_string_length = 2;
            local_130.field_2._M_allocated_capacity._0_3_ = 0x2f2e;
          }
          else {
            local_130._M_string_length = 0;
            local_130.field_2._M_allocated_capacity =
                 local_130.field_2._M_allocated_capacity & 0xffffffffffffff00;
            do {
              std::__cxx11::string::append((char *)&local_130);
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
          }
        }
        anon_unknown_0::GetJSFilename((string *)local_108,options,filename);
        uVar16 = (GeneratorOptions *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          uVar16 = local_130.field_2._M_allocated_capacity;
        }
        pGVar4 = (GeneratorOptions *)
                 ((long)&(((string *)local_130._M_string_length)->_M_dataplus)._M_p +
                 (long)&(((string *)local_108._8_8_)->_M_dataplus)._M_p);
        if ((ulong)uVar16 < pGVar4) {
          pGVar12 = (GeneratorOptions *)0xf;
          if ((GeneratorOptions *)local_108._0_8_ != (GeneratorOptions *)(local_108 + 0x10)) {
            pGVar12 = (GeneratorOptions *)local_108._16_8_;
          }
          if (pGVar12 < pGVar4) goto LAB_00228fd8;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)local_108,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
        }
        else {
LAB_00228fd8:
          puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,local_108._0_8_)
          ;
        }
        local_98._0_8_ = local_98 + 0x10;
        psVar1 = puVar9 + 2;
        if ((size_type *)*puVar9 == psVar1) {
          local_98._16_8_ = *psVar1;
          local_98._24_8_ = puVar9[3];
        }
        else {
          local_98._16_8_ = *psVar1;
          local_98._0_8_ = (size_type *)*puVar9;
        }
        local_98._8_8_ = puVar9[1];
        *puVar9 = psVar1;
        puVar9[1] = 0;
        *(undefined1 *)psVar1 = 0;
        io::Printer::Print(local_c0,"var $alias$ = require(\'$file$\');\n","alias",
                           (string *)local_68,"file",(string *)local_98);
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
        }
        if ((GeneratorOptions *)local_108._0_8_ != (GeneratorOptions *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < *(int *)((long)&(local_110->output_dir).field_2 + 8));
    }
  }
  local_68._24_8_ = local_68 + 8;
  local_68._8_4_ = _S_red;
  local_68._16_8_ = 0;
  local_40 = 0;
  local_98._24_8_ = local_98 + 8;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_98._16_8_ = 0;
  local_70 = 0;
  pGVar4 = (GeneratorOptions *)(local_108 + 0x10);
  paVar5 = &local_130.field_2;
  local_78 = (_Rb_tree_node_base *)local_98._24_8_;
  local_48 = (_Base_ptr)local_68._24_8_;
  if (0 < *(int *)&(local_110->extension).field_2) {
    lVar15 = 0;
    lVar8 = 0;
    do {
      pGVar12 = local_110;
      if (((options->import_style != kImportClosure) ||
          (*(char *)(*(long *)&local_110->one_output_file_per_input_file + 0x50 + lVar15) != '\x01')
          ) || (iVar18 = std::__cxx11::string::compare
                                   ((char *)**(undefined8 **)
                                              (*(long *)(*(long *)&local_110->
                                                                   one_output_file_per_input_file +
                                                         0x58 + lVar15) + 0x10)), iVar18 != 0)) {
        (anonymous_namespace)::GetFilePath_abi_cxx11_
                  (&local_b8,(_anonymous_namespace_ *)options,local_110,(FileDescriptor *)pGVar12);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_b8);
        pGVar12 = (GeneratorOptions *)(plVar10 + 2);
        if ((GeneratorOptions *)*plVar10 == pGVar12) {
          local_108._16_8_ = (pGVar12->output_dir)._M_dataplus._M_p;
          local_108._24_8_ = plVar10[3];
          local_108._0_8_ = pGVar4;
        }
        else {
          local_108._16_8_ = (pGVar12->output_dir)._M_dataplus._M_p;
          local_108._0_8_ = (GeneratorOptions *)*plVar10;
        }
        local_108._8_8_ = plVar10[1];
        *plVar10 = (long)pGVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                  ((string *)&local_e8,
                   (_anonymous_namespace_ *)
                   (*(long *)&local_110->one_output_file_per_input_file + lVar15),
                   (GeneratorOptions *)local_108._8_8_,(FieldDescriptor *)pGVar12);
        pGVar12 = (GeneratorOptions *)0xf;
        if ((GeneratorOptions *)local_108._0_8_ != pGVar4) {
          pGVar12 = (GeneratorOptions *)local_108._16_8_;
        }
        pGVar3 = (GeneratorOptions *)
                 ((long)&(((string *)local_108._8_8_)->_M_dataplus)._M_p + local_e8._8_8_);
        if (pGVar12 < pGVar3) {
          uVar16 = (GeneratorOptions *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_allocated_capacity != &local_d8) {
            uVar16 = local_d8._M_allocated_capacity;
          }
          if ((ulong)uVar16 < pGVar3) goto LAB_00229267;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,local_108._0_8_);
        }
        else {
LAB_00229267:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append(local_108,local_e8._M_allocated_capacity);
        }
        puVar2 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar2) {
          local_130.field_2._M_allocated_capacity = *puVar2;
          local_130.field_2._8_8_ = puVar9[3];
          local_130._M_dataplus._M_p = (pointer)paVar5;
        }
        else {
          local_130.field_2._M_allocated_capacity = *puVar2;
          local_130._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_130._M_string_length = puVar9[1];
        *puVar9 = puVar2;
        puVar9[1] = 0;
        *(undefined1 *)puVar2 = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_68,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar5) {
          operator_delete(local_130._M_dataplus._M_p,
                          (ulong)(local_130.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_allocated_capacity != &local_d8) {
          operator_delete((void *)local_e8._M_allocated_capacity,
                          (ulong)(local_d8._M_allocated_capacity + 1));
        }
        if ((GeneratorOptions *)local_108._0_8_ != pGVar4) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        local_130._M_dataplus._M_p =
             (pointer)(*(long *)&local_110->one_output_file_per_input_file + lVar15);
        std::
        _Rb_tree<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*,std::_Identity<google::protobuf::FieldDescriptor_const*>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_insert_unique<google::protobuf::FieldDescriptor_const*>
                  ((_Rb_tree<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*,std::_Identity<google::protobuf::FieldDescriptor_const*>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)local_98,(FieldDescriptor **)&local_130);
      }
      lVar8 = lVar8 + 1;
      lVar15 = lVar15 + 0xa8;
    } while (lVar8 < *(int *)&(local_110->extension).field_2);
  }
  this_00 = local_38;
  pPVar6 = local_c0;
  p_Var17 = local_38;
  FindProvidesForFile((Generator *)local_38,options,local_c0,(FileDescriptor *)local_110,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68);
  GenerateProvides((Generator *)p_Var17,options,pPVar6,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
  local_e8._M_allocated_capacity = 0;
  local_e8._8_8_ = 0;
  local_d8._M_allocated_capacity = 0;
  std::
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
            ((vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)local_e8._M_local_buf,(iterator)0x0,(FileDescriptor **)&local_110);
  if (options->import_style == kImportClosure) {
    GenerateRequiresForLibrary
              ((Generator *)this_00,options,pPVar6,
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&local_e8,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_68);
  }
  pGVar12 = local_110;
  GenerateClassesAndEnums((Generator *)this_00,options,pPVar6,(FileDescriptor *)local_110);
  p_Var17 = (_Rb_tree_node_base *)local_98._24_8_;
  while (p_Var17 != (_Rb_tree_node_base *)(local_98 + 8)) {
    pGVar12 = *(GeneratorOptions **)(p_Var17 + 1);
    GenerateExtension((Generator *)this_00,options,pPVar6,(FieldDescriptor *)pGVar12);
    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    this_00 = p_Var17;
    p_Var17 = p_Var11;
  }
  if (options->import_style == kImportCommonJs) {
    (anonymous_namespace)::GetFilePath_abi_cxx11_
              (&local_130,(_anonymous_namespace_ *)options,local_110,(FileDescriptor *)pGVar12);
    io::Printer::Print(pPVar6,"goog.object.extend(exports, $package$);\n","package",&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar5) {
      operator_delete(local_130._M_dataplus._M_p,
                      (ulong)(local_130.field_2._M_allocated_capacity + 1));
    }
  }
  if (well_known_types_js[0].name != (char *)0x0) {
    pFVar19 = well_known_types_js;
    do {
      pFVar19 = pFVar19 + 1;
      local_108._0_8_ = pGVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"google/protobuf/","");
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)local_108);
      pcVar13 = (char *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar13) {
        local_130.field_2._M_allocated_capacity = *(undefined8 *)pcVar13;
        local_130.field_2._8_8_ = puVar9[3];
        local_130._M_dataplus._M_p = (pointer)paVar5;
      }
      else {
        local_130.field_2._M_allocated_capacity = *(undefined8 *)pcVar13;
        local_130._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_130._M_string_length = puVar9[1];
      *puVar9 = pcVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if ((GeneratorOptions *)local_108._0_8_ != pGVar4) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      anon_unknown_0::StripProto(&local_b8,(string *)(local_110->output_dir)._M_dataplus._M_p);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
      pGVar12 = (GeneratorOptions *)(puVar9 + 2);
      if ((GeneratorOptions *)*puVar9 == pGVar12) {
        local_108._16_8_ = (pGVar12->output_dir)._M_dataplus._M_p;
        local_108._24_8_ = puVar9[3];
        local_108._0_8_ = pGVar4;
      }
      else {
        local_108._16_8_ = (pGVar12->output_dir)._M_dataplus._M_p;
        local_108._0_8_ = (GeneratorOptions *)*puVar9;
      }
      local_108._8_8_ = puVar9[1];
      *puVar9 = pGVar12;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if (local_130._M_string_length == local_108._8_8_) {
        if ((GeneratorOptions *)local_130._M_string_length == (GeneratorOptions *)0x0) {
          bVar20 = true;
        }
        else {
          iVar18 = bcmp(local_130._M_dataplus._M_p,(void *)local_108._0_8_,
                        local_130._M_string_length);
          bVar20 = iVar18 == 0;
        }
      }
      else {
        bVar20 = false;
      }
      if ((GeneratorOptions *)local_108._0_8_ != pGVar4) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (bVar20) {
        io::Printer::Print(local_c0,pFVar19[-1].data);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar5) {
        operator_delete(local_130._M_dataplus._M_p,
                        (ulong)(local_130.field_2._M_allocated_capacity + 1));
      }
    } while (pFVar19->name != (char *)0x0);
  }
  if ((void *)local_e8._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_e8._M_allocated_capacity,
                    local_d8._M_allocated_capacity - local_e8._0_8_);
  }
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Rb_tree((_Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
  return;
}

Assistant:

void Generator::GenerateFile(const GeneratorOptions& options,
                             io::Printer* printer,
                             const FileDescriptor* file) const {
  GenerateHeader(options, printer);

  // Generate "require" statements.
  if (options.import_style == GeneratorOptions::kImportCommonJs) {
    printer->Print("var jspb = require('google-protobuf');\n");
    printer->Print("var goog = jspb;\n");
    printer->Print("var global = Function('return this')();\n\n");

    for (int i = 0; i < file->dependency_count(); i++) {
      const string& name = file->dependency(i)->name();
      printer->Print(
          "var $alias$ = require('$file$');\n",
          "alias", ModuleAlias(name),
          "file", GetRootPath(file->name(), name) + GetJSFilename(options, name));
    }
  }

  std::set<string> provided;
  std::set<const FieldDescriptor*> extensions;
  for (int i = 0; i < file->extension_count(); i++) {
    // We honor the jspb::ignore option here only when working with
    // Closure-style imports. Use of this option is discouraged and so we want
    // to avoid adding new support for it.
    if (options.import_style == GeneratorOptions::kImportClosure &&
        IgnoreField(file->extension(i))) {
      continue;
    }
    provided.insert(GetFilePath(options, file) + "." +
                    JSObjectFieldName(options, file->extension(i)));
    extensions.insert(file->extension(i));
  }

  FindProvidesForFile(options, printer, file, &provided);
  GenerateProvides(options, printer, &provided);
  std::vector<const FileDescriptor*> files;
  files.push_back(file);
  if (options.import_style == GeneratorOptions::kImportClosure) {
    GenerateRequiresForLibrary(options, printer, files, &provided);
  }

  GenerateClassesAndEnums(options, printer, file);

  // Generate code for top-level extensions. Extensions nested inside messages
  // are emitted inside GenerateClassesAndEnums().
  for (std::set<const FieldDescriptor*>::const_iterator it = extensions.begin();
       it != extensions.end(); ++it) {
    GenerateExtension(options, printer, *it);
  }

  if (options.import_style == GeneratorOptions::kImportCommonJs) {
    printer->Print("goog.object.extend(exports, $package$);\n",
                   "package", GetFilePath(options, file));
  }

  // Emit well-known type methods.
  for (FileToc* toc = well_known_types_js; toc->name != NULL; toc++) {
    string name = string("google/protobuf/") + toc->name;
    if (name == StripProto(file->name()) + ".js") {
      printer->Print(toc->data);
    }
  }
}